

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2check.cpp
# Opt level: O3

void __thiscall ktxValidator::validationContext::createDfd4Format(validationContext *this)

{
  ktx_uint32_t kVar1;
  uint32_t *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  
  kVar1 = (this->header).vkFormat;
  if (kVar1 == 0x82) {
    uVar4 = 0x20;
    uVar3 = 8;
  }
  else {
    if (kVar1 == 0x81) {
      uVar4 = 0x18;
    }
    else {
      if (kVar1 != 0x80) {
        puVar2 = (uint32_t *)vk2dfd();
        goto LAB_00111538;
      }
      uVar4 = 0x10;
    }
    uVar3 = 4;
  }
  puVar2 = (uint32_t *)createDFDDepthStencil(uVar4,8,uVar3);
LAB_00111538:
  this->pDfd4Format = puVar2;
  return;
}

Assistant:

void createDfd4Format()
        {
            switch(header.vkFormat) {
              case VK_FORMAT_D16_UNORM_S8_UINT:
                // 2 16-bit words. D16 in the first. S8 in the 8 LSBs of the second.
                pDfd4Format = createDFDDepthStencil(16, 8, 4);
                break;
              case VK_FORMAT_D24_UNORM_S8_UINT:
                // 1 32-bit word. D24 in the MSBs. S8 in the LSBs.
                pDfd4Format = createDFDDepthStencil(24, 8, 4);
                break;
              case VK_FORMAT_D32_SFLOAT_S8_UINT:
                // 2 32-bit words. D32 float in the first word. S8 in LSBs of the
                // second.
                pDfd4Format = createDFDDepthStencil(32, 8, 8);
                break;
              default:
                pDfd4Format = vk2dfd((VkFormat)header.vkFormat);
            }
        }